

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_psx_Sem.cpp
# Opt level: O1

__pid_t __thiscall axl::sys::psx::NamedSem::wait(NamedSem *this,void *__stat_loc)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint_t timeout;
  timespec timespec;
  timespec local_28;
  
  timeout = (uint_t)__stat_loc;
  if (timeout == 0xffffffff) {
    uVar1 = sem_wait((sem_t *)(this->
                              super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>
                              ).m_h);
    uVar3 = (ulong)uVar1;
  }
  else if (timeout == 0) {
    uVar1 = sem_trywait((sem_t *)(this->
                                 super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>
                                 ).m_h);
    uVar3 = (ulong)uVar1;
  }
  else {
    local_28.tv_sec = 0;
    local_28.tv_nsec = 0;
    getAbsTimespecFromTimeout(timeout,&local_28);
    uVar1 = sem_timedwait((sem_t *)(this->
                                   super_Handle<sem_t_*,_axl::sys::psx::CloseNamedSem,_axl::sl::Zero<sem_t_*>_>
                                   ).m_h,(timespec *)&local_28);
    uVar3 = (ulong)uVar1;
  }
  iVar2 = (int)uVar3;
  if (iVar2 != 0) {
    uVar3 = err::setLastSystemError();
  }
  return (__pid_t)CONCAT71((int7)(uVar3 >> 8),iVar2 == 0);
}

Assistant:

bool
NamedSem::wait(uint_t timeout) {
	int result;

	switch (timeout) {
	case 0:
		result = ::sem_trywait(m_h);
		break;

	case -1:
		result = ::sem_wait(m_h);
		break;

	default:
		timespec timespec = { 0 };
		sys::getAbsTimespecFromTimeout(timeout, &timespec);
		result = ::sem_timedwait(m_h, &timespec);
	}

	return err::complete(result == 0);
}